

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PopStyleColor(int count)

{
  float fVar1;
  ImGuiColorMod *pIVar2;
  ImVec4 *pIVar3;
  int in_EDI;
  ImGuiColorMod *backup;
  ImGuiContext *g;
  ImGuiContext *this;
  int local_4;
  
  this = GImGui;
  for (local_4 = in_EDI; 0 < local_4; local_4 = local_4 + -1) {
    pIVar2 = ImVector<ImGuiColorMod>::back((ImVector<ImGuiColorMod> *)this);
    pIVar3 = (this->Style).Colors + pIVar2->Col;
    fVar1 = (pIVar2->BackupValue).y;
    pIVar3->x = (pIVar2->BackupValue).x;
    pIVar3->y = fVar1;
    fVar1 = (pIVar2->BackupValue).w;
    pIVar3->z = (pIVar2->BackupValue).z;
    pIVar3->w = fVar1;
    ImVector<ImGuiColorMod>::pop_back((ImVector<ImGuiColorMod> *)this);
  }
  return;
}

Assistant:

void ImGui::PopStyleColor(int count)
{
    ImGuiContext& g = *GImGui;
    while (count > 0)
    {
        ImGuiColorMod& backup = g.ColorModifiers.back();
        g.Style.Colors[backup.Col] = backup.BackupValue;
        g.ColorModifiers.pop_back();
        count--;
    }
}